

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O1

void __thiscall Ptex::v2_4::PtexReaderCache::pruneFiles(PtexReaderCache *this)

{
  bool bVar1;
  PtexCachedReader *this_00;
  size_t sVar2;
  long lVar3;
  
  lVar3 = this->_filesOpen - this->_maxFiles;
  if (lVar3 != 0) {
    do {
      this_00 = PtexLruList<Ptex::v2_4::PtexCachedReader,_&Ptex::v2_4::PtexCachedReader::_openFilesItem>
                ::pop(&this->_openFiles);
      if (this_00 == (PtexCachedReader *)0x0) {
        sVar2 = 0;
LAB_001068d2:
        this->_filesOpen = sVar2;
      }
      else {
        bVar1 = PtexReader::tryClose(&this_00->super_PtexReader);
        if (bVar1) {
          lVar3 = lVar3 + -1;
          sVar2 = this->_filesOpen - 1;
          goto LAB_001068d2;
        }
      }
    } while ((this_00 != (PtexCachedReader *)0x0) && (lVar3 != 0));
  }
  return;
}

Assistant:

void PtexReaderCache::pruneFiles()
{
    size_t numToClose = _filesOpen - _maxFiles;
    if (numToClose > 0) {
        while (numToClose) {
            PtexCachedReader* reader = _openFiles.pop();
            if (!reader) { _filesOpen = 0; break; }
            if (reader->tryClose()) {
                --numToClose;
                --_filesOpen;
            }
        }
    }
}